

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallelepiped.cpp
# Opt level: O3

void __thiscall Parallelepiped::_calculateTriangles(Parallelepiped *this)

{
  mat4 *ltw;
  vector<Triangle_*,_std::allocator<Triangle_*>_> *this_00;
  Triangle *pTVar1;
  Triangle *local_268;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_260;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_250;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_240;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_230;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_220;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_210;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_200;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1f0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1e0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1d0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1c0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1b0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1a0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_190;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_180;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_170;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_160;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_150;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_140;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_130;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_120;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_110;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_100;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_f0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_e0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_d0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_c0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_b0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_a0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_90;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_80;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_70;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_60;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_50;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_40;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_30;
  
  pTVar1 = (Triangle *)operator_new(0x60);
  ltw = &(this->super_SceneObject).localToWorld;
  local_30._0_8_ = *(undefined8 *)&(this->v0).field_0;
  local_30.field_0.z = (this->v0).field_0.field_0.z;
  local_40._0_8_ = *(undefined8 *)&(this->v1).field_0;
  local_40.field_0.z = (this->v1).field_0.field_0.z;
  local_50._0_8_ = *(undefined8 *)&(this->v2).field_0;
  local_50.field_0.z = (this->v2).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_30.field_0,(vec3 *)&local_40.field_0,
                     (vec3 *)&local_50.field_0,(this->super_SceneObject).color);
  this_00 = &this->triangles;
  local_268 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_268);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_60._0_8_ = *(undefined8 *)&(this->v1).field_0;
  local_60.field_0.z = (this->v1).field_0.field_0.z;
  local_70._0_8_ = *(undefined8 *)&(this->v3).field_0;
  local_70.field_0.z = (this->v3).field_0.field_0.z;
  local_80._0_8_ = *(undefined8 *)&(this->v2).field_0;
  local_80.field_0.z = (this->v2).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_60.field_0,(vec3 *)&local_70.field_0,
                     (vec3 *)&local_80.field_0,(this->super_SceneObject).color);
  local_268 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_268);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_90._0_8_ = *(undefined8 *)&(this->v0).field_0;
  local_90.field_0.z = (this->v0).field_0.field_0.z;
  local_a0._0_8_ = *(undefined8 *)&(this->v4).field_0;
  local_a0.field_0.z = (this->v4).field_0.field_0.z;
  local_b0._0_8_ = *(undefined8 *)&(this->v1).field_0;
  local_b0.field_0.z = (this->v1).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_90.field_0,(vec3 *)&local_a0.field_0,
                     (vec3 *)&local_b0.field_0,(this->super_SceneObject).color);
  local_268 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_268);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_c0._0_8_ = *(undefined8 *)&(this->v1).field_0;
  local_c0.field_0.z = (this->v1).field_0.field_0.z;
  local_d0._0_8_ = *(undefined8 *)&(this->v4).field_0;
  local_d0.field_0.z = (this->v4).field_0.field_0.z;
  local_e0._0_8_ = *(undefined8 *)&(this->v5).field_0;
  local_e0.field_0.z = (this->v5).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_c0.field_0,(vec3 *)&local_d0.field_0,
                     (vec3 *)&local_e0.field_0,(this->super_SceneObject).color);
  local_268 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_268);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_f0._0_8_ = *(undefined8 *)&(this->v0).field_0;
  local_f0.field_0.z = (this->v0).field_0.field_0.z;
  local_100._0_8_ = *(undefined8 *)&(this->v2).field_0;
  local_100.field_0.z = (this->v2).field_0.field_0.z;
  local_110._0_8_ = *(undefined8 *)&(this->v4).field_0;
  local_110.field_0.z = (this->v4).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_f0.field_0,(vec3 *)&local_100.field_0,
                     (vec3 *)&local_110.field_0,(this->super_SceneObject).color);
  local_268 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_268);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_120._0_8_ = *(undefined8 *)&(this->v2).field_0;
  local_120.field_0.z = (this->v2).field_0.field_0.z;
  local_130._0_8_ = *(undefined8 *)&(this->v6).field_0;
  local_130.field_0.z = (this->v6).field_0.field_0.z;
  local_140._0_8_ = *(undefined8 *)&(this->v4).field_0;
  local_140.field_0.z = (this->v4).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_120.field_0,(vec3 *)&local_130.field_0,
                     (vec3 *)&local_140.field_0,(this->super_SceneObject).color);
  local_268 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_268);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_150._0_8_ = *(undefined8 *)&(this->v1).field_0;
  local_150.field_0.z = (this->v1).field_0.field_0.z;
  local_160._0_8_ = *(undefined8 *)&(this->v5).field_0;
  local_160.field_0.z = (this->v5).field_0.field_0.z;
  local_170._0_8_ = *(undefined8 *)&(this->v3).field_0;
  local_170.field_0.z = (this->v3).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_150.field_0,(vec3 *)&local_160.field_0,
                     (vec3 *)&local_170.field_0,(this->super_SceneObject).color);
  local_268 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_268);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_180._0_8_ = *(undefined8 *)&(this->v3).field_0;
  local_180.field_0.z = (this->v3).field_0.field_0.z;
  local_190._0_8_ = *(undefined8 *)&(this->v5).field_0;
  local_190.field_0.z = (this->v5).field_0.field_0.z;
  local_1a0._0_8_ = *(undefined8 *)&(this->v7).field_0;
  local_1a0.field_0.z = (this->v7).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_180.field_0,(vec3 *)&local_190.field_0,
                     (vec3 *)&local_1a0.field_0,(this->super_SceneObject).color);
  local_268 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_268);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_1b0._0_8_ = *(undefined8 *)&(this->v2).field_0;
  local_1b0.field_0.z = (this->v2).field_0.field_0.z;
  local_1c0._0_8_ = *(undefined8 *)&(this->v3).field_0;
  local_1c0.field_0.z = (this->v3).field_0.field_0.z;
  local_1d0._0_8_ = *(undefined8 *)&(this->v6).field_0;
  local_1d0.field_0.z = (this->v6).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_1b0.field_0,(vec3 *)&local_1c0.field_0,
                     (vec3 *)&local_1d0.field_0,(this->super_SceneObject).color);
  local_268 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_268);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_1e0._0_8_ = *(undefined8 *)&(this->v3).field_0;
  local_1e0.field_0.z = (this->v3).field_0.field_0.z;
  local_1f0._0_8_ = *(undefined8 *)&(this->v7).field_0;
  local_1f0.field_0.z = (this->v7).field_0.field_0.z;
  local_200._0_8_ = *(undefined8 *)&(this->v6).field_0;
  local_200.field_0.z = (this->v6).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_1e0.field_0,(vec3 *)&local_1f0.field_0,
                     (vec3 *)&local_200.field_0,(this->super_SceneObject).color);
  local_268 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_268);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_210._0_8_ = *(undefined8 *)&(this->v4).field_0;
  local_210.field_0.z = (this->v4).field_0.field_0.z;
  local_220._0_8_ = *(undefined8 *)&(this->v6).field_0;
  local_220.field_0.z = (this->v6).field_0.field_0.z;
  local_230._0_8_ = *(undefined8 *)&(this->v5).field_0;
  local_230.field_0.z = (this->v5).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_210.field_0,(vec3 *)&local_220.field_0,
                     (vec3 *)&local_230.field_0,(this->super_SceneObject).color);
  local_268 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_268);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_240._0_8_ = *(undefined8 *)&(this->v5).field_0;
  local_240.field_0.z = (this->v5).field_0.field_0.z;
  local_250._0_8_ = *(undefined8 *)&(this->v6).field_0;
  local_250.field_0.z = (this->v6).field_0.field_0.z;
  local_260._0_8_ = *(undefined8 *)&(this->v7).field_0;
  local_260.field_0.z = (this->v7).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_240.field_0,(vec3 *)&local_250.field_0,
                     (vec3 *)&local_260.field_0,(this->super_SceneObject).color);
  local_268 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_268);
  return;
}

Assistant:

void Parallelepiped::_calculateTriangles() {
    //front
    triangles.push_back(new Triangle(localToWorld, v0, v1, v2, color));
    triangles.push_back(new Triangle(localToWorld, v1, v3, v2, color));
    
    //bottom
    triangles.push_back(new Triangle(localToWorld, v0, v4, v1, color));
    triangles.push_back(new Triangle(localToWorld, v1, v4, v5, color));
    
    //left
    triangles.push_back(new Triangle(localToWorld, v0, v2, v4, color));
    triangles.push_back(new Triangle(localToWorld, v2, v6, v4, color));
    
    //right
    triangles.push_back(new Triangle(localToWorld, v1, v5, v3, color));
    triangles.push_back(new Triangle(localToWorld, v3, v5, v7, color));
    
    //top
    triangles.push_back(new Triangle(localToWorld, v2, v3, v6, color));
    triangles.push_back(new Triangle(localToWorld, v3, v7, v6, color));
    
    //back
    triangles.push_back(new Triangle(localToWorld, v4, v6, v5, color));
    triangles.push_back(new Triangle(localToWorld, v5, v6, v7, color));
}